

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::SingleTex2DShader::shadeFragments
          (SingleTex2DShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  GenericVec4 *pGVar1;
  int iVar2;
  ulong uVar3;
  int fragNdx;
  int fragNdx_00;
  FragmentPacket *packet;
  Vec4 v_coord;
  undefined1 local_68 [24];
  ulong local_50;
  ulong local_48;
  float local_40;
  float local_3c;
  
  uVar3 = 0;
  local_50 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    local_50 = uVar3;
  }
  local_68._16_8_ = packets;
  for (local_48 = 0; local_48 != local_50; local_48 = local_48 + 1) {
    packet = (FragmentPacket *)(local_68._16_8_ + local_48 * 0x40);
    for (fragNdx_00 = 0; fragNdx_00 != 4; fragNdx_00 = fragNdx_00 + 1) {
      rr::readVarying<float>((rr *)&local_40,packet,context,0,fragNdx_00);
      sglr::rc::Texture2D::sample((Texture2D *)local_68,local_40,local_3c,0.0);
      iVar2 = (fragNdx_00 + (int)uVar3) * context->numFragmentOutputs;
      pGVar1 = context->outputArray;
      pGVar1[iVar2].v.uData[0] = local_68._0_4_;
      pGVar1[iVar2].v.uData[1] = local_68._4_4_;
      pGVar1[iVar2].v.uData[2] = local_68._8_4_;
      pGVar1[iVar2].v.uData[3] = local_68._12_4_;
    }
    uVar3 = (ulong)((int)uVar3 + 4);
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4 v_coord = rr::readVarying<float>(packets[packetNdx], context, 0, fragNdx);
			const float		lod		= 0.0f;

			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, this->m_uniforms[0].sampler.tex2D->sample(v_coord.x(), v_coord.y(), lod));
		}
	}